

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                 (RepeatedField<int> *value,size_t tag_size,CachedSize *cached_size)

{
  long lVar1;
  bool bVar2;
  int n;
  const_pointer data;
  size_t sVar3;
  ulong uVar4;
  
  bVar2 = RepeatedField<int>::empty(value);
  if (bVar2) {
    if (cached_size->atom_ != 0) {
      cached_size->atom_ = 0;
    }
    sVar3 = 0;
  }
  else {
    data = RepeatedField<int>::data(value);
    n = RepeatedField<int>::size(value);
    sVar3 = VarintSize<true,false,int>(data,n);
    CachedSize::SetNonZero(cached_size,(int)sVar3);
    uVar4 = (long)(int)sVar3 | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + tag_size + sVar3;
  }
  return sVar3;
}

Assistant:

size_t WireFormatLite::SInt32SizeWithPackedTagSize(
    const RepeatedField<int32_t>& value, size_t tag_size,
    const internal::CachedSize& cached_size) {
  if (value.empty()) {
    cached_size.Set(0);
    return 0;
  }
  size_t res;
  PROTOBUF_ALWAYS_INLINE_CALL res = SInt32Size(value);
  cached_size.SetNonZero(ToCachedSize(res));
  return tag_size + res + Int32Size(static_cast<int32_t>(res));
}